

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O1

list_conflict ForListInsertsort(list_conflict r,list_conflict *tail,int p)

{
  string puVar1;
  list plVar2;
  int iVar3;
  list plVar4;
  list *pplVar5;
  list *pplVar6;
  list plVar7;
  list_conflict plVar8;
  list_conflict plVar9;
  
  plVar7 = r->next;
  plVar9 = r;
  if (plVar7 != (list)0x0) {
    pplVar6 = &r->next;
    plVar8 = r;
    do {
      iVar3 = scmp(plVar7->str + p,plVar8->str + p);
      r = plVar7;
      if (iVar3 < 0) {
        iVar3 = scmp(plVar7->str + p,plVar9->str + p);
        r = plVar8;
        if (iVar3 < 1) {
          *pplVar6 = plVar7->next;
          plVar7->next = plVar9;
          plVar9 = plVar7;
        }
        else {
          puVar1 = plVar7->str;
          plVar4 = plVar9->next;
          plVar2 = plVar9;
          while( true ) {
            pplVar5 = &plVar2->next;
            iVar3 = scmp(puVar1 + p,plVar4->str + p);
            if (iVar3 < 0) break;
            plVar2 = *pplVar5;
            puVar1 = plVar7->str;
            plVar4 = plVar2->next;
          }
          *pplVar6 = plVar7->next;
          plVar7->next = *pplVar5;
          *pplVar5 = plVar7;
        }
      }
      pplVar6 = &r->next;
      plVar7 = r->next;
      plVar8 = r;
    } while (plVar7 != (list)0x0);
  }
  *tail = r;
  return plVar9;
}

Assistant:

list ForListInsertsort(list r, list *tail, int p)
{
   list fi, la, t;

   for (fi = la = r, r = r->next; r; r = la->next)
      if (scmp(r->str+p, la->str+p) >= 0) /* add to tail */
         la = r;
      else if (scmp(r->str+p, fi->str+p) <= 0) { /* add to head */
         la->next = r->next;
         r->next = fi;
         fi = r;
      } else { /* insert into middle */
         for (t = fi; scmp(r->str+p, t->next->str+p) >= 0; )
            t = t->next;
         la->next = r->next;
         r->next = t->next;
         t->next = r;
      }
   *tail = la;
   return fi;
}